

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardswish_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::HardSwish_x86_avx2::forward_inplace(HardSwish_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [24];
  undefined1 (*pauVar17) [32];
  long in_RSI;
  long *in_RDI;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  __m256 _ans_2;
  __m256 _p_2;
  __m256 _one_2;
  __m256 _zero_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _ans_1;
  __m128 _p_1;
  int i_1;
  __m128 _one_1;
  __m128 _zero_1;
  float *ptr_1;
  int q_1;
  __m256 _ans;
  __m256 _p;
  int i;
  __m256 _one;
  __m256 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_fffffffffffff5a8;
  Mat *this_00;
  Mat *in_stack_fffffffffffff5b0;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  int local_98c;
  Mat local_988;
  undefined1 (*local_940) [32];
  int local_934;
  undefined8 local_930;
  undefined8 uStack_928;
  void *local_920;
  int *piStack_918;
  int local_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 local_8f0;
  undefined8 uStack_8e8;
  Mat local_8d8;
  Mat *local_890;
  int local_884;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  int local_824;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  Mat local_7b8;
  undefined1 (*local_770) [32];
  int local_768;
  int local_764;
  int local_760;
  int local_75c;
  int local_758;
  int local_754;
  uint local_730;
  uint local_72c;
  undefined4 local_728;
  undefined4 local_724;
  uint local_720;
  uint local_71c;
  undefined4 local_718;
  undefined4 local_714;
  undefined1 (*local_710) [32];
  undefined1 (*local_708) [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 (*local_488) [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 (*local_448) [32];
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float local_424;
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float local_404;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 local_3e4;
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 local_3cc;
  Mat *local_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  void *local_3a0;
  int *piStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  void *local_320;
  int *piStack_318;
  Mat *local_308;
  undefined1 local_300 [16];
  undefined1 auStack_2f0 [16];
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined1 local_2c0 [32];
  undefined4 local_2a0;
  undefined4 local_29c;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined1 local_280 [16];
  undefined1 auStack_270 [16];
  uint local_260;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  uint local_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  uint local_208;
  uint local_204;
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined1 local_1c0 [32];
  undefined4 local_1a0;
  undefined4 local_19c;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 local_18c;
  undefined4 local_188;
  undefined4 local_184;
  undefined1 local_180 [16];
  undefined1 auStack_170 [16];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined1 local_140 [32];
  uint local_120;
  uint local_11c;
  uint local_118;
  uint local_114;
  uint local_110;
  uint local_10c;
  uint local_108;
  uint local_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_754 = *(int *)(in_RSI + 0x2c);
  local_758 = *(int *)(in_RSI + 0x30);
  local_75c = *(int *)(in_RSI + 0x38);
  local_760 = local_754 * local_758;
  local_764 = *(int *)(in_RSI + 0x18);
  if (local_764 == 8) {
    local_764 = 8;
    for (local_768 = 0; local_768 < local_75c; local_768 = local_768 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff5b0,(int)((ulong)in_stack_fffffffffffff5a8 >> 0x20));
      pauVar17 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_7b8);
      ncnn::Mat::~Mat((Mat *)0x8e6951);
      local_714 = 0;
      local_2c4 = 0;
      local_2c8 = 0;
      local_2cc = 0;
      local_2d0 = 0;
      local_2d4 = 0;
      local_2d8 = 0;
      local_2dc = 0;
      local_2e0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_300 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_2f0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_800 = local_300._0_8_;
      uStack_7f8 = local_300._8_8_;
      uStack_7f0 = auStack_2f0._0_8_;
      uStack_7e8 = auStack_2f0._8_8_;
      local_718 = 0x3f800000;
      local_284 = 0x3f800000;
      local_288 = 0x3f800000;
      local_28c = 0x3f800000;
      local_290 = 0x3f800000;
      local_294 = 0x3f800000;
      local_298 = 0x3f800000;
      local_29c = 0x3f800000;
      local_2a0 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar18._16_16_ = auVar1;
      auVar18._0_16_ = auVar2;
      local_2c0._0_8_ = auVar2._0_8_;
      local_2c0._8_8_ = auVar2._8_8_;
      local_2c0._16_8_ = auVar1._0_8_;
      local_2c0._24_8_ = auVar1._8_8_;
      local_820 = local_2c0._0_8_;
      uStack_818 = local_2c0._8_8_;
      uStack_810 = local_2c0._16_8_;
      uStack_808 = local_2c0._24_8_;
      local_770 = pauVar17;
      for (local_824 = 0; local_824 < local_760; local_824 = local_824 + 1) {
        local_708 = local_770;
        local_860 = *(undefined8 *)*local_770;
        uStack_858 = *(undefined8 *)(*local_770 + 8);
        uStack_850 = *(undefined8 *)(*local_770 + 0x10);
        uStack_848 = *(undefined8 *)(*local_770 + 0x18);
        local_71c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_71c),ZEXT416(local_71c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_71c),0x20);
        local_280 = vinsertps_avx(auVar1,ZEXT416(local_71c),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_71c),ZEXT416(local_71c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_71c),0x20);
        auStack_270 = vinsertps_avx(auVar1,ZEXT416(local_71c),0x30);
        local_720 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_720),ZEXT416(local_720),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_720),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_720),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_720),ZEXT416(local_720),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_720),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_720),0x30);
        auVar19._16_16_ = auVar1;
        auVar19._0_16_ = auVar3;
        local_240._0_8_ = auVar3._0_8_;
        local_680 = local_240._0_8_;
        local_240._8_8_ = auVar3._8_8_;
        uStack_678 = local_240._8_8_;
        local_240._16_8_ = auVar1._0_8_;
        uStack_670 = local_240._16_8_;
        local_240._24_8_ = auVar1._8_8_;
        uStack_668 = local_240._24_8_;
        local_6a0 = local_280._0_8_;
        uStack_698 = local_280._8_8_;
        uStack_690 = auStack_270._0_8_;
        uStack_688 = auStack_270._8_8_;
        local_e0 = local_240._0_8_;
        uStack_d8 = local_240._8_8_;
        uStack_d0 = local_240._16_8_;
        uStack_c8 = local_240._24_8_;
        local_100 = local_280._0_8_;
        uStack_f8 = local_280._8_8_;
        uStack_f0 = auStack_270._0_8_;
        uStack_e8 = auStack_270._8_8_;
        auVar13._16_8_ = local_240._16_8_;
        auVar13._0_16_ = auVar3;
        auVar13._24_8_ = local_240._24_8_;
        auVar12._16_8_ = auStack_270._0_8_;
        auVar12._0_16_ = local_280;
        auVar12._24_8_ = auStack_270._8_8_;
        auVar1 = vfmadd213ps_fma(auVar13,*local_770,auVar12);
        local_880 = auVar1._0_8_;
        local_5e0 = local_880;
        uStack_878 = auVar1._8_8_;
        uStack_5d8 = uStack_878;
        uStack_5d0 = 0;
        uStack_5c8 = 0;
        local_600 = local_300._0_8_;
        uStack_5f8 = local_300._8_8_;
        uStack_5f0 = auStack_2f0._0_8_;
        uStack_5e8 = auStack_2f0._8_8_;
        auVar9._16_8_ = auStack_2f0._0_8_;
        auVar9._0_16_ = local_300;
        auVar9._24_8_ = auStack_2f0._8_8_;
        auVar20 = vmaxps_avx(ZEXT1632(auVar1),auVar9);
        local_880 = auVar20._0_8_;
        local_560 = local_880;
        uStack_878 = auVar20._8_8_;
        uStack_558 = uStack_878;
        uStack_870 = auVar20._16_8_;
        uStack_550 = uStack_870;
        uStack_868 = auVar20._24_8_;
        uStack_548 = uStack_868;
        local_580 = local_2c0._0_8_;
        uStack_578 = local_2c0._8_8_;
        uStack_570 = local_2c0._16_8_;
        uStack_568 = local_2c0._24_8_;
        auVar11._16_8_ = local_2c0._16_8_;
        auVar11._0_16_ = auVar2;
        auVar11._24_8_ = local_2c0._24_8_;
        auVar20 = vminps_avx(auVar20,auVar11);
        local_880 = auVar20._0_8_;
        uVar5 = local_880;
        uStack_878 = auVar20._8_8_;
        uVar6 = uStack_878;
        uStack_870 = auVar20._16_8_;
        uVar7 = uStack_870;
        uStack_868 = auVar20._24_8_;
        uVar8 = uStack_868;
        local_4e0._0_4_ = auVar20._0_4_;
        local_4e0._4_4_ = auVar20._4_4_;
        uStack_4d8._0_4_ = auVar20._8_4_;
        uStack_4d8._4_4_ = auVar20._12_4_;
        uStack_4d0._0_4_ = auVar20._16_4_;
        uStack_4d0._4_4_ = auVar20._20_4_;
        uStack_4c8._0_4_ = auVar20._24_4_;
        uStack_4c8._4_4_ = auVar20._28_4_;
        local_500._0_4_ = (float)local_860;
        local_500._4_4_ = (float)((ulong)local_860 >> 0x20);
        uStack_4f8._0_4_ = (float)uStack_858;
        uStack_4f8._4_4_ = (float)((ulong)uStack_858 >> 0x20);
        uStack_4f0._0_4_ = (float)uStack_850;
        uStack_4f0._4_4_ = (float)((ulong)uStack_850 >> 0x20);
        uStack_4e8._0_4_ = (float)uStack_848;
        local_880 = CONCAT44(local_4e0._4_4_ * local_500._4_4_,(float)local_4e0 * (float)local_500);
        uStack_878._0_4_ = (float)uStack_4d8 * (float)uStack_4f8;
        uStack_878._4_4_ = uStack_4d8._4_4_ * uStack_4f8._4_4_;
        uStack_870._0_4_ = (float)uStack_4d0 * (float)uStack_4f0;
        uStack_870._4_4_ = uStack_4d0._4_4_ * uStack_4f0._4_4_;
        auVar16 = _local_880;
        uStack_868._0_4_ = (float)uStack_4c8 * (float)uStack_4e8;
        uStack_868._4_4_ = uStack_4c8._4_4_;
        auVar20 = _local_880;
        local_448 = local_770;
        local_480 = local_880;
        uStack_478 = uStack_878;
        uStack_870 = auVar16._16_8_;
        uStack_470 = uStack_870;
        uStack_868 = auVar20._24_8_;
        uStack_468 = uStack_868;
        *(undefined8 *)*local_770 = local_880;
        *(undefined8 *)(*local_770 + 8) = uStack_878;
        *(undefined8 *)(*local_770 + 0x10) = uStack_870;
        *(undefined8 *)(*local_770 + 0x18) = uStack_868;
        local_770 = local_770 + 1;
        _local_880 = auVar20;
        local_660 = local_860;
        uStack_658 = uStack_858;
        uStack_650 = uStack_850;
        uStack_648 = uStack_848;
        local_500 = local_860;
        uStack_4f8 = uStack_858;
        uStack_4f0 = uStack_850;
        uStack_4e8 = uStack_848;
        local_4e0 = uVar5;
        uStack_4d8 = uVar6;
        uStack_4d0 = uVar7;
        uStack_4c8 = uVar8;
        local_260 = local_71c;
        local_25c = local_71c;
        local_258 = local_71c;
        local_254 = local_71c;
        local_250 = local_71c;
        local_24c = local_71c;
        local_248 = local_71c;
        local_244 = local_71c;
        local_240 = auVar19;
        local_220 = local_720;
        local_21c = local_720;
        local_218 = local_720;
        local_214 = local_720;
        local_210 = local_720;
        local_20c = local_720;
        local_208 = local_720;
        local_204 = local_720;
        local_c0 = local_860;
        uStack_b8 = uStack_858;
        uStack_b0 = uStack_850;
        uStack_a8 = uStack_848;
      }
      local_2c0 = auVar18;
    }
  }
  else if (local_764 == 4) {
    local_764 = 4;
    for (local_884 = 0; local_884 < local_75c; local_884 = local_884 + 1) {
      this_00 = &local_8d8;
      ncnn::Mat::channel(in_stack_fffffffffffff5b0,(int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffff5b0 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
      ncnn::Mat::~Mat((Mat *)0x8e6ff0);
      local_3cc = 0;
      local_3e0 = 0;
      uStack_3dc = 0;
      uStack_3d8 = 0;
      uStack_3d4 = 0;
      local_8f0 = 0;
      uStack_8e8 = 0;
      local_3e4 = 0x3f800000;
      local_400 = 0x3f800000;
      uStack_3fc = 0x3f800000;
      uStack_3f8 = 0x3f800000;
      uStack_3f4 = 0x3f800000;
      local_900 = 0x3f8000003f800000;
      uStack_8f8 = 0x3f8000003f800000;
      local_890 = in_stack_fffffffffffff5b0;
      for (local_904 = 0; local_904 < local_760; local_904 = local_904 + 1) {
        local_3c8 = local_890;
        local_920 = local_890->data;
        piStack_918 = local_890->refcount;
        local_420 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_3c0 = CONCAT44(local_420,local_420);
        uStack_3b8 = CONCAT44(local_420,local_420);
        local_440 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_380 = CONCAT44(local_440,local_440);
        uStack_378 = CONCAT44(local_440,local_440);
        local_370._0_4_ = SUB84(local_920,0);
        local_370._4_4_ = (float)((ulong)local_920 >> 0x20);
        uStack_368._0_4_ = SUB84(piStack_918,0);
        uStack_368._4_4_ = (float)((ulong)piStack_918 >> 0x20);
        local_3b0 = (float)local_370 * local_440;
        fStack_3ac = local_370._4_4_ * local_440;
        fStack_3a8 = (float)uStack_368 * local_440;
        fStack_3a4 = uStack_368._4_4_ * local_440;
        local_930 = (void *)CONCAT44(fStack_3ac + local_420,local_3b0 + local_420);
        uStack_928._0_4_ = fStack_3a8 + local_420;
        uStack_928._4_4_ = fStack_3a4 + local_420;
        local_350 = local_930;
        uStack_348 = uStack_928;
        auVar1._8_8_ = uStack_928;
        auVar1._0_8_ = local_930;
        auVar1 = vmaxps_avx(auVar1,ZEXT816(0));
        local_930 = auVar1._0_8_;
        local_330 = local_930;
        uStack_928 = auVar1._8_8_;
        uStack_328 = uStack_928;
        auVar2._8_8_ = 0x3f8000003f800000;
        auVar2._0_8_ = 0x3f8000003f800000;
        auVar1 = vminps_avx(auVar1,auVar2);
        local_930 = auVar1._0_8_;
        uVar5 = local_930;
        uStack_928 = auVar1._8_8_;
        uVar6 = uStack_928;
        local_390._0_4_ = auVar1._0_4_;
        local_390._4_4_ = auVar1._4_4_;
        uStack_388._0_4_ = auVar1._8_4_;
        uStack_388._4_4_ = auVar1._12_4_;
        local_930 = (void *)CONCAT44(local_390._4_4_ * local_370._4_4_,
                                     (float)local_390 * (float)local_370);
        uStack_928._0_4_ = (float)uStack_388 * (float)uStack_368;
        uStack_928._4_4_ = uStack_388._4_4_ * uStack_368._4_4_;
        local_308 = local_890;
        local_320 = local_930;
        piStack_318 = uStack_928;
        local_890->data = local_930;
        local_890->refcount = uStack_928;
        local_890 = (Mat *)&local_890->elemsize;
        fStack_43c = local_440;
        fStack_438 = local_440;
        fStack_434 = local_440;
        local_424 = local_440;
        fStack_41c = local_420;
        fStack_418 = local_420;
        fStack_414 = local_420;
        local_404 = local_420;
        local_3a0 = local_920;
        piStack_398 = piStack_918;
        local_390 = uVar5;
        uStack_388 = uVar6;
        local_370 = local_920;
        uStack_368 = piStack_918;
        local_360 = local_8f0;
        uStack_358 = uStack_8e8;
        local_340 = local_900;
        uStack_338 = uStack_8f8;
      }
    }
  }
  else {
    for (local_934 = 0; local_934 < local_75c; local_934 = local_934 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff5b0,(int)((ulong)in_stack_fffffffffffff5a8 >> 0x20));
      pauVar17 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_988);
      ncnn::Mat::~Mat((Mat *)0x8e7351);
      local_98c = 0;
      local_724 = 0;
      local_1c4 = 0;
      local_1c8 = 0;
      local_1cc = 0;
      local_1d0 = 0;
      local_1d4 = 0;
      local_1d8 = 0;
      local_1dc = 0;
      local_1e0 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_200 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_1f0 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_728 = 0x3f800000;
      local_184 = 0x3f800000;
      local_188 = 0x3f800000;
      local_18c = 0x3f800000;
      local_190 = 0x3f800000;
      local_194 = 0x3f800000;
      local_198 = 0x3f800000;
      local_19c = 0x3f800000;
      local_1a0 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar20._16_16_ = auVar1;
      auVar20._0_16_ = auVar2;
      local_1c0._0_8_ = auVar2._0_8_;
      local_1c0._8_8_ = auVar2._8_8_;
      local_1c0._16_8_ = auVar1._0_8_;
      local_1c0._24_8_ = auVar1._8_8_;
      local_940 = pauVar17;
      for (; local_98c + 7 < local_760; local_98c = local_98c + 8) {
        local_710 = local_940;
        local_6c0 = *(undefined8 *)*local_940;
        uStack_6b8 = *(undefined8 *)(*local_940 + 8);
        uStack_6b0 = *(undefined8 *)(*local_940 + 0x10);
        uStack_6a8 = *(undefined8 *)(*local_940 + 0x18);
        local_72c = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_72c),ZEXT416(local_72c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_72c),0x20);
        local_180 = vinsertps_avx(auVar1,ZEXT416(local_72c),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_72c),ZEXT416(local_72c),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_72c),0x20);
        auStack_170 = vinsertps_avx(auVar1,ZEXT416(local_72c),0x30);
        local_730 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_730),ZEXT416(local_730),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_730),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_730),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_730),ZEXT416(local_730),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_730),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_730),0x30);
        auVar21._16_16_ = auVar1;
        auVar21._0_16_ = auVar3;
        local_140._0_8_ = auVar3._0_8_;
        local_6e0 = local_140._0_8_;
        local_140._8_8_ = auVar3._8_8_;
        uStack_6d8 = local_140._8_8_;
        local_140._16_8_ = auVar1._0_8_;
        uStack_6d0 = local_140._16_8_;
        local_140._24_8_ = auVar1._8_8_;
        uStack_6c8 = local_140._24_8_;
        local_700 = local_180._0_8_;
        uStack_6f8 = local_180._8_8_;
        uStack_6f0 = auStack_170._0_8_;
        uStack_6e8 = auStack_170._8_8_;
        local_80 = local_140._0_8_;
        uStack_78 = local_140._8_8_;
        uStack_70 = local_140._16_8_;
        uStack_68 = local_140._24_8_;
        local_a0 = local_180._0_8_;
        uStack_98 = local_180._8_8_;
        uStack_90 = auStack_170._0_8_;
        uStack_88 = auStack_170._8_8_;
        auVar15._16_8_ = local_140._16_8_;
        auVar15._0_16_ = auVar3;
        auVar15._24_8_ = local_140._24_8_;
        auVar14._16_8_ = auStack_170._0_8_;
        auVar14._0_16_ = local_180;
        auVar14._24_8_ = auStack_170._8_8_;
        auVar1 = vfmadd213ps_fma(auVar15,*local_940,auVar14);
        local_a20 = auVar1._0_8_;
        local_620 = local_a20;
        uStack_a18 = auVar1._8_8_;
        uStack_618 = uStack_a18;
        uStack_610 = 0;
        uStack_608 = 0;
        local_640 = local_200._0_8_;
        uStack_638 = local_200._8_8_;
        uStack_630 = auStack_1f0._0_8_;
        uStack_628 = auStack_1f0._8_8_;
        auVar4._16_8_ = auStack_1f0._0_8_;
        auVar4._0_16_ = local_200;
        auVar4._24_8_ = auStack_1f0._8_8_;
        auVar4 = vmaxps_avx(ZEXT1632(auVar1),auVar4);
        local_a20 = auVar4._0_8_;
        local_5a0 = local_a20;
        uStack_a18 = auVar4._8_8_;
        uStack_598 = uStack_a18;
        uStack_a10 = auVar4._16_8_;
        uStack_590 = uStack_a10;
        uStack_a08 = auVar4._24_8_;
        uStack_588 = uStack_a08;
        local_5c0 = local_1c0._0_8_;
        uStack_5b8 = local_1c0._8_8_;
        uStack_5b0 = local_1c0._16_8_;
        uStack_5a8 = local_1c0._24_8_;
        auVar10._16_8_ = local_1c0._16_8_;
        auVar10._0_16_ = auVar2;
        auVar10._24_8_ = local_1c0._24_8_;
        auVar4 = vminps_avx(auVar4,auVar10);
        local_a20 = auVar4._0_8_;
        uVar5 = local_a20;
        uStack_a18 = auVar4._8_8_;
        uVar6 = uStack_a18;
        uStack_a10 = auVar4._16_8_;
        uVar7 = uStack_a10;
        uStack_a08 = auVar4._24_8_;
        uVar8 = uStack_a08;
        local_520._0_4_ = auVar4._0_4_;
        local_520._4_4_ = auVar4._4_4_;
        uStack_518._0_4_ = auVar4._8_4_;
        uStack_518._4_4_ = auVar4._12_4_;
        uStack_510._0_4_ = auVar4._16_4_;
        uStack_510._4_4_ = auVar4._20_4_;
        uStack_508._0_4_ = auVar4._24_4_;
        uStack_508._4_4_ = auVar4._28_4_;
        local_540._0_4_ = (float)local_6c0;
        local_540._4_4_ = (float)((ulong)local_6c0 >> 0x20);
        uStack_538._0_4_ = (float)uStack_6b8;
        uStack_538._4_4_ = (float)((ulong)uStack_6b8 >> 0x20);
        uStack_530._0_4_ = (float)uStack_6b0;
        uStack_530._4_4_ = (float)((ulong)uStack_6b0 >> 0x20);
        uStack_528._0_4_ = (float)uStack_6a8;
        local_a20 = CONCAT44(local_520._4_4_ * local_540._4_4_,(float)local_520 * (float)local_540);
        uStack_a18._0_4_ = (float)uStack_518 * (float)uStack_538;
        uStack_a18._4_4_ = uStack_518._4_4_ * uStack_538._4_4_;
        uStack_a10._0_4_ = (float)uStack_510 * (float)uStack_530;
        uStack_a10._4_4_ = uStack_510._4_4_ * uStack_530._4_4_;
        auVar16 = _local_a20;
        uStack_a08._0_4_ = (float)uStack_508 * (float)uStack_528;
        uStack_a08._4_4_ = uStack_508._4_4_;
        auVar4 = _local_a20;
        local_488 = local_940;
        local_4c0 = local_a20;
        uStack_4b8 = uStack_a18;
        uStack_a10 = auVar16._16_8_;
        uStack_4b0 = uStack_a10;
        uStack_a08 = auVar4._24_8_;
        uStack_4a8 = uStack_a08;
        *(undefined8 *)*local_940 = local_a20;
        *(undefined8 *)(*local_940 + 8) = uStack_a18;
        *(undefined8 *)(*local_940 + 0x10) = uStack_a10;
        *(undefined8 *)(*local_940 + 0x18) = uStack_a08;
        local_940 = local_940 + 1;
        local_540 = local_6c0;
        uStack_538 = uStack_6b8;
        uStack_530 = uStack_6b0;
        uStack_528 = uStack_6a8;
        local_520 = uVar5;
        uStack_518 = uVar6;
        uStack_510 = uVar7;
        uStack_508 = uVar8;
        local_160 = local_72c;
        local_15c = local_72c;
        local_158 = local_72c;
        local_154 = local_72c;
        local_150 = local_72c;
        local_14c = local_72c;
        local_148 = local_72c;
        local_144 = local_72c;
        local_140 = auVar21;
        local_120 = local_730;
        local_11c = local_730;
        local_118 = local_730;
        local_114 = local_730;
        local_110 = local_730;
        local_10c = local_730;
        local_108 = local_730;
        local_104 = local_730;
        local_60 = local_6c0;
        uStack_58 = uStack_6b8;
        uStack_50 = uStack_6b0;
        uStack_48 = uStack_6a8;
      }
      for (; local_98c < local_760; local_98c = local_98c + 1) {
        if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *(float *)*local_940) {
          if (*(float *)*local_940 <= *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc))
          {
            *(float *)*local_940 =
                 *(float *)*local_940 *
                 (*(float *)*local_940 *
                  *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                 *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
          }
        }
        else {
          *(undefined4 *)*local_940 = 0;
        }
        local_940 = (undefined1 (*) [32])(*local_940 + 4);
      }
      local_1c0 = auVar20;
    }
  }
  return 0;
}

Assistant:

int HardSwish_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _ans = _mm256_mul_ps(_ans, _p);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _ans = _mm_mul_ps(_ans, _p);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _ans = _mm256_mul_ps(_ans, _p);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                ;
            else
                *ptr = *ptr * (*ptr * alpha + beta);
            ++ptr;
        }
    }

    return 0;
}